

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintInt32
          (FieldValuePrinterWrapper *this,int32 val,BaseTextGenerator *generator)

{
  pointer pFVar1;
  uint in_ESI;
  string *in_stack_ffffffffffffffb8;
  BaseTextGenerator *in_stack_ffffffffffffffc0;
  string local_38 [44];
  uint local_c;
  
  local_c = in_ESI;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->((unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
                         *)0x4399a9);
  (*pFVar1->_vptr_FieldValuePrinter[3])(local_38,pFVar1,(ulong)local_c);
  TextFormat::BaseTextGenerator::PrintString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void PrintInt32(int32 val,
                  TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintInt32(val));
  }